

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::RsCaseItemSyntax::isKind(SyntaxKind kind)

{
  return kind == StandardRsCaseItem || kind == DefaultRsCaseItem;
}

Assistant:

bool RsCaseItemSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultRsCaseItem:
        case SyntaxKind::StandardRsCaseItem:
            return true;
        default:
            return false;
    }
}